

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O0

result<unsigned_int> *
sockpp::inet_address::resolve_name(result<unsigned_int> *__return_storage_ptr__,string *saddr)

{
  int iVar1;
  char *pcVar2;
  error_code eVar3;
  error_code eVar4;
  uint local_9c;
  sockaddr *psStack_98;
  in_addr_t addr;
  sockaddr_in *ipv4;
  error_category *local_88;
  int local_80;
  undefined4 uStack_7c;
  error_category *local_78;
  undefined1 local_70 [8];
  error_code ec;
  undefined1 auStack_58 [4];
  int err;
  addrinfo hints;
  addrinfo *local_20;
  addrinfo *res;
  string *psStack_10;
  in_addr ia;
  string *saddr_local;
  
  psStack_10 = saddr;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = inet_pton(2,pcVar2,(void *)((long)&res + 4));
  if (iVar1 == 1) {
    result<unsigned_int>::result(__return_storage_ptr__,(uint *)((long)&res + 4));
  }
  else {
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_socktype = 0;
    hints.ai_protocol = 0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    auStack_58 = (undefined1  [4])0x0;
    err = 2;
    hints.ai_flags = 1;
    hints.ai_family = 0;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ec._M_cat._4_4_ = getaddrinfo(pcVar2,(char *)0x0,(addrinfo *)auStack_58,&local_20);
    if (ec._M_cat._4_4_ == ~invalid_argument) {
      psStack_98 = local_20->ai_addr;
      local_9c = *(uint *)(psStack_98->sa_data + 2);
      freeaddrinfo(local_20);
      result<unsigned_int>::result(__return_storage_ptr__,&local_9c);
    }
    else {
      std::error_code::error_code((error_code *)local_70);
      if (ec._M_cat._4_4_ == system_error) {
        eVar3 = result<sockpp::none>::last_error();
        local_78 = eVar3._M_cat;
        local_80 = eVar3._M_value;
        local_70._4_4_ = uStack_7c;
        local_70._0_4_ = local_80;
        ec._0_8_ = local_78;
      }
      else {
        eVar4 = make_error_code(ec._M_cat._4_4_);
        local_88 = eVar4._M_cat;
        ipv4._0_4_ = eVar4._M_value;
        local_70._4_4_ = ipv4._4_4_;
        local_70._0_4_ = (int)ipv4;
        ec._0_8_ = local_88;
      }
      result<unsigned_int>::result(__return_storage_ptr__,(error_code *)local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

result<in_addr_t> inet_address::resolve_name(const string& saddr) noexcept {
#if !defined(_WIN32)
    in_addr ia;
    if (::inet_pton(ADDRESS_FAMILY, saddr.c_str(), &ia) == 1)
        return ia.s_addr;
#endif

    addrinfo *res, hints = addrinfo{};
    hints.ai_family = ADDRESS_FAMILY;
    hints.ai_socktype = SOCK_STREAM;

    int err = ::getaddrinfo(saddr.c_str(), NULL, &hints, &res);

    if (err != 0) {
        error_code ec{};
#if defined(_WIN32)
        ec = error_code{errno, system_category()};
#else
        if (err == EAI_SYSTEM)
            ec = result<>::last_error();
        else
            ec = make_error_code(static_cast<gai_errc>(err));
#endif
        return ec;
    }

    auto ipv4 = reinterpret_cast<sockaddr_in*>(res->ai_addr);
    auto addr = ipv4->sin_addr.s_addr;
    freeaddrinfo(res);
    return addr;
}